

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,minstd_rand *rng)

{
  bool bVar1;
  entry_type eVar2;
  __type _Var3;
  const_reference pvVar4;
  Dictionary *in_RDI;
  int32_t wid;
  int32_t h;
  int32_t ntokens;
  string token;
  uniform_real_distribution<double> uniform;
  undefined4 in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff6c;
  real in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff74;
  int id;
  Dictionary *in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  int local_54;
  string local_50 [80];
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             7.5293578757058e-318);
  std::__cxx11::string::string(local_50);
  local_54 = 0;
  reset((Dictionary *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
        (istream *)in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x17412a);
  while( true ) {
    bVar1 = readWord(in_RDI,(istream *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                     ,(string *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         find((Dictionary *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              (string *)in_stack_ffffffffffffff78);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->word2int_,(long)in_stack_ffffffffffffff80);
    id = *pvVar4;
    if (-1 < id) {
      local_54 = local_54 + 1;
      eVar2 = getType((Dictionary *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      iVar5 = id;
      if (eVar2 == word) {
        in_stack_ffffffffffffff78 =
             (Dictionary *)
             std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)CONCAT44(id,in_stack_ffffffffffffff70),
                        (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        bVar1 = discard(in_stack_ffffffffffffff78,id,in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff74 = id;
        if (!bVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (value_type_conflict1 *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff74 = id;
        }
      }
      if ((0x400 < local_54) ||
         (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(iVar5,in_stack_ffffffffffffff90),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_RDI), _Var3)) break;
    }
  }
  std::__cxx11::string::~string(local_50);
  return local_54;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::minstd_rand& rng) const {
  std::uniform_real_distribution<> uniform(0, 1);
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  while (readWord(in, token)) {
    int32_t h = find(token);
    int32_t wid = word2int_[h];
    if (wid < 0) {
      continue;
    }

    ntokens++;
    if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
      words.push_back(wid);
    }
    if (ntokens > MAX_LINE_SIZE || token == EOS) {
      break;
    }
  }
  return ntokens;
}